

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O3

bool __thiscall ON_PointCloud::Read(ON_PointCloud *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int minor_version;
  int major_version;
  int local_18 [2];
  
  local_18[0] = 0;
  local_18[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18 + 1,local_18);
  if (!bVar1) {
    return bVar1;
  }
  if (local_18[1] != 1) {
    return bVar1;
  }
  bVar1 = ON_BinaryArchive::ReadArray(file,&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
  if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadPlane(file,&this->m_plane), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadBoundingBox(file,&this->m_bbox), bVar1)) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_flags);
    if (!bVar1) {
      return bVar1;
    }
    if (local_18[0] < 1) {
      return bVar1;
    }
    bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_N);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_C);
      if (!bVar1) {
        return bVar1;
      }
      if (local_18[0] < 2) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_V);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_PointCloud::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version == 1 ) 
  {
    if (rc) rc = file.ReadArray( m_P );
    if (rc) rc = file.ReadPlane( m_plane );
    if (rc) rc = file.ReadBoundingBox( m_bbox );
    if (rc) rc = file.ReadInt( &m_flags);

    if (rc && minor_version >= 1 )
    {
      if (rc) rc = file.ReadArray( m_N );
      if (rc) rc = file.ReadArray( m_C );
      if (rc && minor_version >= 2)
      {
        rc = file.ReadArray( m_V );
      }
    }
  }
  return rc;
}